

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_ktrace(jit_State *J)

{
  IRRef IVar1;
  uint uVar2;
  IRIns *pIVar3;
  IRIns *ir;
  IRRef ref;
  jit_State *J_local;
  IRRef ref_1;
  
  IVar1 = (J->cur).nk;
  uVar2 = IVar1 - 2;
  if (uVar2 < J->irbotlim) {
    lj_ir_growbot(J);
  }
  (J->cur).nk = uVar2;
  pIVar3 = (J->cur).ir + uVar2;
  (pIVar3->field_1).t.irt = '\t';
  (pIVar3->field_1).o = '\x1c';
  (pIVar3->field_1).op12 = 0;
  (pIVar3->field_0).prev = 0;
  return IVar1 + 0x8fffffe;
}

Assistant:

TRef lj_ir_ktrace(jit_State *J)
{
  IRRef ref = ir_nextkgc(J);
  IRIns *ir = IR(ref);
  lj_assertJ(irt_toitype_(IRT_P64) == LJ_TTRACE, "mismatched type mapping");
  ir->t.irt = IRT_P64;
  ir->o = LJ_GC64 ? IR_KNUM : IR_KNULL;  /* Not IR_KGC yet, but same size. */
  ir->op12 = 0;
  ir->prev = 0;
  return TREF(ref, IRT_P64);
}